

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void textsize_cb(Fl_Value_Input *i,void *v)

{
  bool bVar1;
  int iVar2;
  Fl_Widget_Type *q;
  Fl_Type *pFVar3;
  int s;
  Fl_Color c;
  Fl_Font n;
  int local_3c;
  undefined1 local_38 [4];
  undefined1 local_34 [4];
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x2b])
                      (current_widget,0,local_34,&local_3c,local_38);
    if (iVar2 == 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
  }
  else {
    local_3c = (int)(i->super_Fl_Valuator).value_;
    if (local_3c < 1) {
      local_3c = Fl_Widget_Type::default_size;
    }
    if (Fl_Type::first != (Fl_Type *)0x0) {
      bVar1 = false;
      pFVar3 = Fl_Type::first;
      do {
        if ((pFVar3->selected != '\0') &&
           (iVar2 = (*pFVar3->_vptr_Fl_Type[0x17])(pFVar3), iVar2 != 0)) {
          (*pFVar3->_vptr_Fl_Type[0x2b])(pFVar3,2,local_34,&local_3c,local_38);
          Fl_Widget::redraw((Fl_Widget *)pFVar3[1].prev);
          bVar1 = true;
        }
        pFVar3 = pFVar3->next;
      } while (pFVar3 != (Fl_Type *)0x0);
      if (bVar1) {
        set_modflag(1);
      }
    }
  }
  Fl_Valuator::value(&i->super_Fl_Valuator,(double)local_3c);
  return;
}

Assistant:

void textsize_cb(Fl_Value_Input* i, void* v) {
  Fl_Font n; int s; Fl_Color c;
  if (v == LOAD) {
    if (!current_widget->textstuff(0,n,s,c)) {i->deactivate(); return;}
    i->activate();
  } else {
    int mod = 0;
    s = int(i->value());
    if (s <= 0) s = Fl_Widget_Type::default_size;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->textstuff(2,n,s,c);
	q->o->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
  i->value(s);
}